

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O2

bool __thiscall irr::gui::CGUIEnvironment::removeFocus(CGUIEnvironment *this,IGUIElement *element)

{
  int iVar1;
  IGUIElement *pIVar2;
  SEvent e;
  
  pIVar2 = this->Focus;
  if (pIVar2 == element && pIVar2 != (IGUIElement *)0x0) {
    iVar1 = (*(pIVar2->super_IEventReceiver)._vptr_IEventReceiver[2])();
    if ((char)iVar1 != '\0') {
      return false;
    }
    pIVar2 = this->Focus;
  }
  if (pIVar2 != (IGUIElement *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((pIVar2->super_IEventReceiver)._vptr_IEventReceiver[-3] +
               (long)&(pIVar2->super_IEventReceiver)._vptr_IEventReceiver));
    this->Focus = (IGUIElement *)0x0;
  }
  return true;
}

Assistant:

bool CGUIEnvironment::removeFocus(IGUIElement *element)
{
	if (Focus && Focus == element) {
		SEvent e;
		e.EventType = EET_GUI_EVENT;
		e.GUIEvent.Caller = Focus;
		e.GUIEvent.Element = 0;
		e.GUIEvent.EventType = EGET_ELEMENT_FOCUS_LOST;
		if (Focus->OnEvent(e)) {
			return false;
		}
	}
	if (Focus) {
		Focus->drop();
		Focus = 0;
	}

	return true;
}